

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O3

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::times_x_inplace(ChebyshevExpansion *this)

{
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  bool bVar4;
  Index new_rows;
  ulong uVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  uVar1 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  dVar8 = this->m_xmax;
  dVar10 = this->m_xmin;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)this,uVar1 + 1,uVar1 + 1,1);
  if ((-1 < (long)uVar1) &&
     (uVar2 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows, (long)uVar1 < (long)uVar2)) {
    dVar7 = (dVar8 - dVar10) * 0.5;
    dVar10 = (dVar8 + dVar10) * 0.5;
    pdVar3 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    pdVar3[uVar1] = 0.0;
    dVar8 = 0.0;
    if (2 < uVar1) {
      dVar8 = *pdVar3;
      dVar9 = pdVar3[1];
      *pdVar3 = dVar9 * 0.5 * dVar7 + dVar10 * dVar8;
      if (uVar1 != 3) {
        pdVar3[1] = (pdVar3[2] * 0.5 + dVar8) * dVar7 + dVar10 * dVar9;
        lVar6 = 0;
        do {
          if (uVar2 - 2 == lVar6) goto LAB_0012f00e;
          dVar8 = pdVar3[lVar6 + 2];
          pdVar3[lVar6 + 2] = (dVar9 + pdVar3[lVar6 + 3]) * 0.5 * dVar7 + dVar10 * dVar8;
          lVar6 = lVar6 + 1;
          dVar9 = dVar8;
        } while (uVar1 - 3 != lVar6);
      }
    }
    uVar5 = uVar1 - 1;
    while ((-1 < (long)(uVar1 - 1) && (uVar5 < uVar2))) {
      dVar9 = pdVar3[uVar5];
      pdVar3[uVar5] = dVar8 * 0.5 * dVar7 + dVar10 * dVar9;
      bVar4 = (long)uVar1 <= (long)uVar5;
      uVar5 = uVar5 + 1;
      dVar8 = dVar9;
      if (bVar4) {
        return this;
      }
    }
  }
LAB_0012f00e:
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                ,0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

ChebyshevExpansion& ChebyshevExpansion::times_x_inplace() {
        Eigen::Index N = m_c.size() - 1; // N is the order of A
        double diff = ((m_xmax - m_xmin) / 2.0), plus = (m_xmax + m_xmin) / 2.0;
        double cim1old = 0, ciold = 0;
        m_c.conservativeResize(N+2);
        m_c(N+1) = 0.0; // Fill the last entry with a zero
        if (N > 1) {
            // 0-th element
            cim1old = m_c(0); // store the current 0-th element in temporary variable
            m_c(0) = diff*(0.5*m_c(1)) + plus*m_c(0);
        }
        if (N > 2) {
            // 1-th element
            ciold = m_c(1); // store the current 1-th element in temporary variable
            m_c(1) = diff*(cim1old + 0.5*m_c(2)) + plus*m_c(1);
            cim1old = ciold;
        }
        for (Eigen::Index i = 2; i <= N-1; ++i) {
            ciold = m_c(i); // store the current i-th element in temporary variable
            m_c(i) = diff*(0.5*(cim1old + m_c(i + 1)))+plus*m_c(i);
            cim1old = ciold;
        }
        for (Eigen::Index i = N; i <= N + 1; ++i) {
            ciold = m_c(i); // store the current i-th element in temporary variable
            m_c(i) = diff*(0.5*cim1old) + plus*m_c(i);
            cim1old = ciold;
        }
        return *this;
    }